

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O2

PropertyString * __thiscall
Js::ScriptContext::GetPropertyString2(ScriptContext *this,char16 ch1,char16 ch2)

{
  uint uVar1;
  uint uVar2;
  
  if (0xffb4 < (ushort)(ch2 + L'ﾅ') && 0xffb4 < (ushort)(ch1 + L'ﾅ')) {
    uVar1 = PropertyStringMap::PStrMapIndex(ch1);
    if ((((this->super_ScriptContextBase).javascriptLibrary)->cache).propertyStrings[uVar1].ptr !=
        (PropertyStringMap *)0x0) {
      uVar2 = PropertyStringMap::PStrMapIndex(ch2);
      return ((((this->super_ScriptContextBase).javascriptLibrary)->cache).propertyStrings[uVar1].
             ptr)->strLen2[uVar2].ptr;
    }
  }
  return (PropertyString *)0x0;
}

Assistant:

PropertyString* ScriptContext::GetPropertyString2(char16 ch1, char16 ch2)
    {
        if (ch1 < '0' || ch1 > 'z' || ch2 < '0' || ch2 > 'z')
        {
            return NULL;
        }
        const uint i = PropertyStringMap::PStrMapIndex(ch1);
        if (this->Cache()->propertyStrings[i] == NULL)
        {
            return NULL;
        }
        const uint j = PropertyStringMap::PStrMapIndex(ch2);
        return this->Cache()->propertyStrings[i]->strLen2[j];
    }